

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Molecule.cpp
# Opt level: O2

void __thiscall
OpenMD::Molecule::addProperty(Molecule *this,shared_ptr<OpenMD::GenericData> *genData)

{
  __shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::__shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_20,&genData->super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>
            );
  PropertyMap::addProperty(&this->properties_,(shared_ptr<OpenMD::GenericData> *)&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return;
}

Assistant:

void Molecule::addProperty(std::shared_ptr<GenericData> genData) {
    properties_.addProperty(genData);
  }